

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2dPoint ON_LiftInverse(ON_2dPoint P,ON_Interval *dom,bool *closed)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ON_2dPoint OVar9;
  double local_48;
  
  dVar5 = P.y;
  local_48 = P.x;
  if ((*closed != false) || (dVar6 = dVar5, closed[1] == true)) {
    lVar3 = 0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      dVar6 = local_48;
      if (closed[lVar3] == true) {
        if (!bVar1) {
          dVar6 = dVar5;
        }
        dVar4 = dom[lVar3].m_t[0];
        if (1.23432101234321e+308 <= ABS(dVar4)) {
          dVar4 = floor((dVar6 - dVar4) / 0.0);
LAB_00581814:
          dVar7 = 0.0;
        }
        else {
          dVar8 = ABS(dom[lVar3].m_t[1]);
          dVar7 = dom[lVar3].m_t[1] - dVar4;
          dVar4 = floor((dVar6 - dVar4) /
                        (double)(-(ulong)(dVar8 < 1.23432101234321e+308) & (ulong)dVar7));
          if (1.23432101234321e+308 <= dVar8) goto LAB_00581814;
        }
        dVar6 = dVar6 - dVar4 * dVar7;
        if (!bVar1) break;
      }
      local_48 = dVar6;
      lVar3 = 1;
      dVar6 = dVar5;
      bVar2 = false;
    } while (bVar1);
  }
  OVar9.y = dVar6;
  OVar9.x = local_48;
  return OVar9;
}

Assistant:

ON_2dPoint ON_LiftInverse(ON_2dPoint P, ON_Interval dom[2], bool closed[2])
{
	ON_2dPoint Q = P;
	if (closed[0] || closed[1])
	{
		for (int di = 0; di < 2; di++)
		{
			if (closed[di])
				Q[di] -= floor((Q[di] - dom[di][0]) / dom[di].Length())*dom[di].Length();

		}
	}
	return Q;
}